

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_to_string.h
# Opt level: O3

string * cute::cute_to_string::backslashQuoteTabNewline
                   (string *__return_storage_ptr__,string *input)

{
  byte bVar1;
  string *psVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (input->_M_string_length != 0) {
    uVar3 = 0;
    do {
      bVar1 = (input->_M_dataplus)._M_p[uVar3];
      if (bVar1 < 0xd) {
        if ((bVar1 != 9) && (bVar1 != 10)) goto LAB_00107002;
LAB_00107012:
        psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((bVar1 == 0xd) || (bVar1 == 0x5c)) goto LAB_00107012;
LAB_00107002:
        psVar2 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < input->_M_string_length);
  }
  return psVar2;
}

Assistant:

static inline std::string backslashQuoteTabNewline(std::string const &input){
			std::string result;
			result.reserve(input.size());
			for (std::string::size_type i=0; i < input.length() ; ++i){
				switch(input[i]) {
					case '\n': result += "\\n"; break;
					case '\t': result += "\\t"; break;
					case '\\': result += "\\\\"; break;
					case '\r': result += "\\r"; break;
					default: result += input[i];
				}
			}
			return result;
		}